

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSimpleProperty,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSimpleProperty *in;
  
  in = (IfcSimpleProperty *)operator_new(0x80);
  *(undefined8 *)&in->field_0x70 = 0;
  *(char **)&in->field_0x78 = "IfcSimpleProperty";
  (in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x10
       = &(in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
          field_0x20;
  *(undefined8 *)
   &(in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x18
       = 0;
  (in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20 =
       0;
  (in->super_IfcProperty).Description.ptr._M_dataplus._M_p =
       (pointer)&(in->super_IfcProperty).Description.ptr.field_2;
  (in->super_IfcProperty).Description.ptr._M_string_length = 0;
  (in->super_IfcProperty).Description.ptr.field_2._M_local_buf[0] = '\0';
  (in->super_IfcProperty).Description.have = false;
  (in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcSimpleProperty_008dd128;
  *(undefined ***)&(in->super_IfcProperty).field_0x68 = &PTR__IfcSimpleProperty_008dd178;
  *(undefined ***)&(in->super_IfcProperty).field_0x58 = &PTR__IfcSimpleProperty_008dd150;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSimpleProperty>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcProperty).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper +
         (long)(in->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
               ._vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }